

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O2

void __thiscall Camera::Camera(Camera *this,vec3 position,vec3 target,vec3 up)

{
  (this->position).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)position._0_8_;
  (this->position).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)position._0_8_ >> 0x20);
  (this->position).field_2 = position.field_2;
  (this->target).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)target._0_8_;
  (this->target).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)target._0_8_ >> 0x20);
  (this->target).field_2 = target.field_2;
  (this->up).field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)up._0_8_
  ;
  (this->up).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)up._0_8_ >> 0x20);
  (this->up).field_2 = up.field_2;
  this->horizontal_angle = 3.1415927;
  this->vertical_angle = 0.0;
  this->initialFoV = 45.0;
  this->FoV = 45.0;
  this->speed = 3.0;
  this->mouse_speed = 0.01;
  this->z_near = 0.1;
  this->z_far = 100.0;
  return;
}

Assistant:

Camera::Camera(glm::vec3 position, glm::vec3 target, glm::vec3 up)
    : position(position), target(target), up(up) {

}